

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testGeneratedFileStream.cxx
# Opt level: O0

int testGeneratedFileStream(int param_1,char **param_2)

{
  bool bVar1;
  char *pcVar2;
  ostream *poVar3;
  allocator<char> local_431;
  string local_430;
  allocator<char> local_409;
  string local_408;
  allocator<char> local_3e1;
  string local_3e0;
  allocator<char> local_3b9;
  string local_3b8;
  undefined1 local_398 [8];
  string file4tmp;
  string file3tmp;
  string file2tmp;
  string file1tmp;
  undefined1 local_310 [8];
  string file4;
  undefined1 local_2e8 [8];
  string file3;
  undefined1 local_2c0 [8];
  string file2;
  allocator<char> local_289;
  undefined1 local_288 [8];
  string file1;
  cmGeneratedFileStream gm;
  int failed;
  char **param_1_local;
  int param_0_local;
  
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)((long)&file1.field_2 + 8),None);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_288,"generatedFile1",&local_289);
  std::allocator<char>::~allocator(&local_289);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2c0,"generatedFile2",
             (allocator<char> *)(file3.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(file3.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2e8,"generatedFile3",
             (allocator<char> *)(file4.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(file4.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_310,"generatedFile4",
             (allocator<char> *)(file1tmp.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(file1tmp.field_2._M_local_buf + 0xf));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&file2tmp.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_288,
                 ".tmp");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&file3tmp.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c0,
                 ".tmp");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&file4tmp.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e8,
                 ".tmp");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_398,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_310,
                 ".tmp");
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3b8,pcVar2,&local_3b9);
  cmGeneratedFileStream::Open
            ((cmGeneratedFileStream *)((long)&file1.field_2 + 8),&local_3b8,false,false);
  std::__cxx11::string::~string((string *)&local_3b8);
  std::allocator<char>::~allocator(&local_3b9);
  std::operator<<((ostream *)((long)&file1.field_2 + 8),"This is generated file 1");
  cmGeneratedFileStream::Close((cmGeneratedFileStream *)((long)&file1.field_2 + 8));
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3e0,pcVar2,&local_3e1);
  cmGeneratedFileStream::Open
            ((cmGeneratedFileStream *)((long)&file1.field_2 + 8),&local_3e0,false,false);
  std::__cxx11::string::~string((string *)&local_3e0);
  std::allocator<char>::~allocator(&local_3e1);
  std::operator<<((ostream *)((long)&file1.field_2 + 8),"This is generated file 2");
  cmGeneratedFileStream::Close((cmGeneratedFileStream *)((long)&file1.field_2 + 8));
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_408,pcVar2,&local_409);
  cmGeneratedFileStream::Open
            ((cmGeneratedFileStream *)((long)&file1.field_2 + 8),&local_408,false,false);
  std::__cxx11::string::~string((string *)&local_408);
  std::allocator<char>::~allocator(&local_409);
  std::operator<<((ostream *)((long)&file1.field_2 + 8),"This is generated file 3");
  cmGeneratedFileStream::Close((cmGeneratedFileStream *)((long)&file1.field_2 + 8));
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_430,pcVar2,&local_431);
  cmGeneratedFileStream::Open
            ((cmGeneratedFileStream *)((long)&file1.field_2 + 8),&local_430,false,false);
  std::__cxx11::string::~string((string *)&local_430);
  std::allocator<char>::~allocator(&local_431);
  std::operator<<((ostream *)((long)&file1.field_2 + 8),"This is generated file 4");
  cmGeneratedFileStream::Close((cmGeneratedFileStream *)((long)&file1.field_2 + 8));
  pcVar2 = (char *)std::__cxx11::string::c_str();
  bVar1 = cmsys::SystemTools::FileExists(pcVar2);
  if (bVar1) {
    pcVar2 = (char *)std::__cxx11::string::c_str();
    bVar1 = cmsys::SystemTools::FileExists(pcVar2);
    if (bVar1) {
      pcVar2 = (char *)std::__cxx11::string::c_str();
      bVar1 = cmsys::SystemTools::FileExists(pcVar2);
      if (bVar1) {
        pcVar2 = (char *)std::__cxx11::string::c_str();
        bVar1 = cmsys::SystemTools::FileExists(pcVar2);
        if (bVar1) {
          pcVar2 = (char *)std::__cxx11::string::c_str();
          bVar1 = cmsys::SystemTools::FileExists(pcVar2);
          if (bVar1) {
            poVar3 = std::operator<<((ostream *)&std::cout,"FAILED: ");
            poVar3 = std::operator<<(poVar3,
                                     "Something wrong with cmGeneratedFileStream. Temporary file is still here: "
                                    );
            pcVar2 = (char *)std::__cxx11::string::c_str();
            poVar3 = std::operator<<(poVar3,pcVar2);
            std::operator<<(poVar3,"\n");
            gm._580_4_ = 1;
          }
          else {
            pcVar2 = (char *)std::__cxx11::string::c_str();
            bVar1 = cmsys::SystemTools::FileExists(pcVar2);
            if (bVar1) {
              poVar3 = std::operator<<((ostream *)&std::cout,"FAILED: ");
              poVar3 = std::operator<<(poVar3,
                                       "Something wrong with cmGeneratedFileStream. Temporary file is still here: "
                                      );
              pcVar2 = (char *)std::__cxx11::string::c_str();
              poVar3 = std::operator<<(poVar3,pcVar2);
              std::operator<<(poVar3,"\n");
              gm._580_4_ = 1;
            }
            else {
              pcVar2 = (char *)std::__cxx11::string::c_str();
              bVar1 = cmsys::SystemTools::FileExists(pcVar2);
              if (bVar1) {
                poVar3 = std::operator<<((ostream *)&std::cout,"FAILED: ");
                poVar3 = std::operator<<(poVar3,
                                         "Something wrong with cmGeneratedFileStream. Temporary file is still here: "
                                        );
                pcVar2 = (char *)std::__cxx11::string::c_str();
                poVar3 = std::operator<<(poVar3,pcVar2);
                std::operator<<(poVar3,"\n");
                gm._580_4_ = 1;
              }
              else {
                pcVar2 = (char *)std::__cxx11::string::c_str();
                gm._580_1_ = cmsys::SystemTools::FileExists(pcVar2);
                if ((bool)gm._580_1_) {
                  poVar3 = std::operator<<((ostream *)&std::cout,"FAILED: ");
                  poVar3 = std::operator<<(poVar3,
                                           "Something wrong with cmGeneratedFileStream. Temporary file is still here: "
                                          );
                  pcVar2 = (char *)std::__cxx11::string::c_str();
                  poVar3 = std::operator<<(poVar3,pcVar2);
                  std::operator<<(poVar3,"\n");
                }
                else {
                  std::operator<<((ostream *)&std::cout,"cmGeneratedFileStream works\n");
                }
                gm._581_3_ = 0;
              }
            }
          }
        }
        else {
          poVar3 = std::operator<<((ostream *)&std::cout,"FAILED: ");
          poVar3 = std::operator<<(poVar3,
                                   "Something wrong with cmGeneratedFileStream. Cannot find file: ")
          ;
          pcVar2 = (char *)std::__cxx11::string::c_str();
          poVar3 = std::operator<<(poVar3,pcVar2);
          std::operator<<(poVar3,"\n");
          gm._580_4_ = 1;
        }
      }
      else {
        poVar3 = std::operator<<((ostream *)&std::cout,"FAILED: ");
        poVar3 = std::operator<<(poVar3,"Something wrong with cmGeneratedFileStream. Found file: ");
        pcVar2 = (char *)std::__cxx11::string::c_str();
        poVar3 = std::operator<<(poVar3,pcVar2);
        std::operator<<(poVar3,"\n");
        gm._580_4_ = 1;
      }
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cout,"FAILED: ");
      poVar3 = std::operator<<(poVar3,
                               "Something wrong with cmGeneratedFileStream. Cannot find file: ");
      pcVar2 = (char *)std::__cxx11::string::c_str();
      poVar3 = std::operator<<(poVar3,pcVar2);
      std::operator<<(poVar3,"\n");
      gm._580_4_ = 1;
    }
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,"FAILED: ");
    poVar3 = std::operator<<(poVar3,"Something wrong with cmGeneratedFileStream. Cannot find file: "
                            );
    pcVar2 = (char *)std::__cxx11::string::c_str();
    poVar3 = std::operator<<(poVar3,pcVar2);
    std::operator<<(poVar3,"\n");
    gm._580_4_ = 1;
  }
  cmsys::SystemTools::RemoveFile((string *)local_288);
  cmsys::SystemTools::RemoveFile((string *)local_2c0);
  cmsys::SystemTools::RemoveFile((string *)local_2e8);
  cmsys::SystemTools::RemoveFile((string *)local_310);
  cmsys::SystemTools::RemoveFile((string *)((long)&file2tmp.field_2 + 8));
  cmsys::SystemTools::RemoveFile((string *)((long)&file3tmp.field_2 + 8));
  cmsys::SystemTools::RemoveFile((string *)((long)&file4tmp.field_2 + 8));
  cmsys::SystemTools::RemoveFile((string *)local_398);
  std::__cxx11::string::~string((string *)local_398);
  std::__cxx11::string::~string((string *)(file4tmp.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(file3tmp.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(file2tmp.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_310);
  std::__cxx11::string::~string((string *)local_2e8);
  std::__cxx11::string::~string((string *)local_2c0);
  std::__cxx11::string::~string((string *)local_288);
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)((long)&file1.field_2 + 8))
  ;
  return gm._580_4_;
}

Assistant:

int testGeneratedFileStream(int /*unused*/, char* /*unused*/ [])
{
  int failed = 0;
  cmGeneratedFileStream gm;
  std::string file1 = "generatedFile1";
  std::string file2 = "generatedFile2";
  std::string file3 = "generatedFile3";
  std::string file4 = "generatedFile4";
  std::string file1tmp = file1 + ".tmp";
  std::string file2tmp = file2 + ".tmp";
  std::string file3tmp = file3 + ".tmp";
  std::string file4tmp = file4 + ".tmp";
  gm.Open(file1.c_str());
  gm << "This is generated file 1";
  gm.Close();
  gm.Open(file2.c_str());
  gm << "This is generated file 2";
  gm.Close();
  gm.Open(file3.c_str());
  gm << "This is generated file 3";
  gm.Close();
  gm.Open(file4.c_str());
  gm << "This is generated file 4";
  gm.Close();
  if (cmSystemTools::FileExists(file1.c_str())) {
    if (cmSystemTools::FileExists(file2.c_str())) {
      if (cmSystemTools::FileExists(file3.c_str())) {
        if (cmSystemTools::FileExists(file4.c_str())) {
          if (cmSystemTools::FileExists(file1tmp.c_str())) {
            cmFailed("Something wrong with cmGeneratedFileStream. Temporary "
                     "file is still here: ",
                     file1tmp.c_str());
          } else if (cmSystemTools::FileExists(file2tmp.c_str())) {
            cmFailed("Something wrong with cmGeneratedFileStream. Temporary "
                     "file is still here: ",
                     file2tmp.c_str());
          } else if (cmSystemTools::FileExists(file3tmp.c_str())) {
            cmFailed("Something wrong with cmGeneratedFileStream. Temporary "
                     "file is still here: ",
                     file3tmp.c_str());
          } else if (cmSystemTools::FileExists(file4tmp.c_str())) {
            cmFailed("Something wrong with cmGeneratedFileStream. Temporary "
                     "file is still here: ",
                     file4tmp.c_str());
          } else {
            std::cout << "cmGeneratedFileStream works\n";
          }
        } else {
          cmFailed(
            "Something wrong with cmGeneratedFileStream. Cannot find file: ",
            file4.c_str());
        }
      } else {
        cmFailed("Something wrong with cmGeneratedFileStream. Found file: ",
                 file3.c_str());
      }
    } else {
      cmFailed(
        "Something wrong with cmGeneratedFileStream. Cannot find file: ",
        file2.c_str());
    }
  } else {
    cmFailed("Something wrong with cmGeneratedFileStream. Cannot find file: ",
             file1.c_str());
  }
  cmSystemTools::RemoveFile(file1);
  cmSystemTools::RemoveFile(file2);
  cmSystemTools::RemoveFile(file3);
  cmSystemTools::RemoveFile(file4);
  cmSystemTools::RemoveFile(file1tmp);
  cmSystemTools::RemoveFile(file2tmp);
  cmSystemTools::RemoveFile(file3tmp);
  cmSystemTools::RemoveFile(file4tmp);

  return failed;
}